

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O3

int lws_http_client_read(lws *wsi,char **buf,int *len)

{
  lws_filepos_t *plVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  byte bVar5;
  int buffered;
  int iVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  lws_tokens eb;
  lws_tokens local_40;
  
  local_40.token = (uchar *)*buf;
  local_40.len = *len;
  buffered = lws_buflist_aware_read
                       (wsi->context->pt + wsi->tsi,wsi,&local_40,'\0',"lws_http_client_read");
  *buf = (char *)local_40.token;
  *len = 0;
  iVar6 = lws_change_pollfd(wsi,0,1);
  iVar10 = -1;
  if (iVar6 == 0) {
    if (buffered < 0) {
      _lws_log(0x10,"%s: SSL capable error\n","lws_http_client_read");
    }
    else if (local_40.len < 1) {
      iVar10 = 0;
    }
    else {
      *len = local_40.len;
      uVar7 = *(ulong *)&wsi->field_0x2dc & 0xffff7fffffffffff;
      *(ulong *)&wsi->field_0x2dc = uVar7;
      iVar10 = 0;
      do {
        bVar4 = true;
        while ((uVar7 & 0x400000000000) != 0) {
          if ((wsi->chunk_parser == '\x02') || (iVar6 = *len, iVar6 == 0)) {
            if (wsi->chunk_remaining == 0) goto LAB_00125add;
            bVar4 = false;
            break;
          }
          switch(wsi->chunk_parser) {
          case '\0':
            if (**buf == '\r') {
              wsi->chunk_parser = '\x01';
            }
            else {
              bVar5 = char_to_hex(**buf);
              if ((char)bVar5 < '\0') {
                pcVar11 = "%s: chunking failure A\n";
                goto LAB_00125b09;
              }
              wsi->chunk_remaining = wsi->chunk_remaining << 4 | (uint)bVar5;
            }
            break;
          case '\x01':
            if (**buf != '\n') {
              pcVar11 = "%s: chunking failure B\n";
LAB_00125b09:
              iVar10 = 1;
              goto LAB_00125b15;
            }
            if (wsi->chunk_remaining == 0) {
              wsi->chunk_parser = '\x05';
            }
            else {
              wsi->chunk_parser = '\x02';
            }
            break;
          case '\x03':
            if (**buf != '\r') {
              pcVar11 = "%s: chunking failure C\n";
              goto LAB_00125aab;
            }
            wsi->chunk_parser = '\x04';
            break;
          case '\x04':
            if (**buf != '\n') {
              pcVar11 = "%s: chunking failure D\n";
              goto LAB_00125b09;
            }
            wsi->chunk_parser = '\0';
            wsi->chunk_remaining = 0;
            break;
          case '\x05':
            if (**buf != '\r') goto LAB_00125a92;
            wsi->chunk_parser = '\x06';
            break;
          case '\x06':
            if (**buf != '\n') {
LAB_00125a92:
              pcVar11 = "%s: chunking failure F\n";
LAB_00125aab:
              _lws_log(1,pcVar11,"lws_http_client_read");
              lwsl_hexdump_level(1,*buf,(long)*len);
              return -1;
            }
            *buf = *buf + 1;
            *len = iVar6 + -1;
            iVar10 = iVar10 + 1;
            _lws_log(8,"final chunk\n");
            goto LAB_00125a6b;
          }
          *buf = *buf + 1;
          *len = *len + -1;
          iVar10 = iVar10 + 1;
          uVar7 = *(ulong *)&wsi->field_0x2dc;
        }
        uVar3 = (wsi->http).rx_content_remain;
        uVar2 = *len;
        uVar12 = uVar3 & 0xffffffff;
        if (uVar2 <= uVar3) {
          uVar12 = (ulong)uVar2;
        }
        if (uVar3 == 0) {
          uVar12 = (ulong)uVar2;
        }
        if (!bVar4) {
          uVar2 = wsi->chunk_remaining;
          uVar9 = (uint)uVar12;
          if ((int)uVar2 < (int)(uint)uVar12) {
            uVar9 = uVar2;
          }
          if (uVar2 != 0) {
            uVar12 = (ulong)uVar9;
          }
        }
        iVar6 = (int)uVar12;
        if ((uVar7 >> 0x22 & 1) == 0) {
          _lws_log(4,"%s: swallowed read (%d)\n","lws_http_client_read",uVar12);
        }
        else {
          iVar8 = user_callback_handle_rxflow
                            (wsi->protocol->callback,wsi,LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,
                             wsi->user_space,*buf,(long)iVar6);
          if (iVar8 != 0) {
            pcVar11 = "%s: RECEIVE_CLIENT_HTTP_READ returned -1\n";
            iVar10 = 8;
            goto LAB_00125b15;
          }
        }
        *buf = *buf + iVar6;
        *len = *len - iVar6;
        uVar7 = *(ulong *)&wsi->field_0x2dc;
        if ((uVar7 & 0x400000000000) == 0) {
          iVar10 = iVar6 + iVar10;
          if ((wsi->http).rx_content_length != 0) {
            plVar1 = &(wsi->http).rx_content_remain;
            *plVar1 = *plVar1 - (long)iVar6;
            if (*plVar1 == 0) {
LAB_00125a6b:
              iVar6 = lws_http_transaction_completed_client((lws *)0x125a73);
              if (iVar6 != 0) {
                pcVar11 = "%s: transaction completed says -1\n";
                iVar10 = 4;
LAB_00125b15:
                _lws_log(iVar10,pcVar11,"lws_http_client_read");
                return -1;
              }
            }
          }
          break;
        }
        if ((wsi->chunk_remaining == 0) ||
           (iVar8 = wsi->chunk_remaining - iVar6, wsi->chunk_remaining = iVar8, iVar8 == 0)) {
          wsi->chunk_parser = '\x03';
        }
        iVar10 = iVar10 + iVar6;
      } while (*len != 0);
LAB_00125add:
      iVar10 = lws_buflist_aware_finished_consuming
                         (wsi,&local_40,iVar10,buffered,"lws_http_client_read");
      iVar10 = -(uint)(iVar10 != 0);
    }
  }
  return iVar10;
}

Assistant:

int
lws_http_client_read(struct lws *wsi, char **buf, int *len)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	struct lws_tokens eb;
	int buffered, n, consumed = 0;

	/*
	 * If the caller provided a non-NULL *buf and nonzero *len, we should
	 * use that as the buffer for the read action, limititing it to *len
	 * (actual payload will be less if chunked headers inside).
	 *
	 * If it's NULL / 0 length, buflist_aware_read will use the pt_serv_buf
	 */

	eb.token = (unsigned char *)*buf;
	eb.len = *len;

	buffered = lws_buflist_aware_read(pt, wsi, &eb, 0, __func__);
	*buf = (char *)eb.token; /* may be pointing to buflist or pt_serv_buf */
	*len = 0;

	/*
	 * we're taking on responsibility for handling used / unused eb
	 * when we leave, via lws_buflist_aware_finished_consuming()
	 */

//	lwsl_notice("%s: eb.len %d ENTRY chunk remaining %d\n", __func__, eb.len,
//			wsi->chunk_remaining);

	/* allow the source to signal he has data again next time */
	if (lws_change_pollfd(wsi, 0, LWS_POLLIN))
		return -1;

	if (buffered < 0) {
		lwsl_debug("%s: SSL capable error\n", __func__);
		return -1;
	}

	if (eb.len <= 0)
		return 0;

	*len = eb.len;
	wsi->client_rx_avail = 0;

	/*
	 * server may insist on transfer-encoding: chunked,
	 * so http client must deal with it
	 */
spin_chunks:
	//lwsl_notice("%s: len %d SPIN chunk remaining %d\n", __func__, *len,
	//		wsi->chunk_remaining);
	while (wsi->chunked && (wsi->chunk_parser != ELCP_CONTENT) && *len) {
		switch (wsi->chunk_parser) {
		case ELCP_HEX:
			if ((*buf)[0] == '\x0d') {
				wsi->chunk_parser = ELCP_CR;
				break;
			}
			n = char_to_hex((*buf)[0]);
			if (n < 0) {
				lwsl_err("%s: chunking failure A\n", __func__);
				return -1;
			}
			wsi->chunk_remaining <<= 4;
			wsi->chunk_remaining |= n;
			break;
		case ELCP_CR:
			if ((*buf)[0] != '\x0a') {
				lwsl_err("%s: chunking failure B\n", __func__);
				return -1;
			}
			if (wsi->chunk_remaining) {
				wsi->chunk_parser = ELCP_CONTENT;
				//lwsl_notice("starting chunk size %d (block rem %d)\n",
				//		wsi->chunk_remaining, *len);
				break;
			}

			wsi->chunk_parser = ELCP_TRAILER_CR;
			break;

		case ELCP_CONTENT:
			break;

		case ELCP_POST_CR:
			if ((*buf)[0] != '\x0d') {
				lwsl_err("%s: chunking failure C\n", __func__);
				lwsl_hexdump_err(*buf, *len);

				return -1;
			}

			wsi->chunk_parser = ELCP_POST_LF;
			break;

		case ELCP_POST_LF:
			if ((*buf)[0] != '\x0a') {
				lwsl_err("%s: chunking failure D\n", __func__);

				return -1;
			}

			wsi->chunk_parser = ELCP_HEX;
			wsi->chunk_remaining = 0;
			break;

		case ELCP_TRAILER_CR:
			if ((*buf)[0] != '\x0d') {
				lwsl_err("%s: chunking failure F\n", __func__);
				lwsl_hexdump_err(*buf, *len);

				return -1;
			}

			wsi->chunk_parser = ELCP_TRAILER_LF;
			break;

		case ELCP_TRAILER_LF:
			if ((*buf)[0] != '\x0a') {
				lwsl_err("%s: chunking failure F\n", __func__);
				lwsl_hexdump_err(*buf, *len);

				return -1;
			}

			(*buf)++;
			(*len)--;
			consumed++;

			lwsl_info("final chunk\n");
			goto completed;
		}
		(*buf)++;
		(*len)--;
		consumed++;
	}

	if (wsi->chunked && !wsi->chunk_remaining)
		goto account_and_ret;

	if (wsi->http.rx_content_remain &&
	    wsi->http.rx_content_remain < (unsigned int)*len)
		n = (int)wsi->http.rx_content_remain;
	else
		n = *len;

	if (wsi->chunked && wsi->chunk_remaining &&
	    wsi->chunk_remaining < n)
		n = wsi->chunk_remaining;

#if defined(LWS_WITH_HTTP_PROXY) && defined(LWS_WITH_HUBBUB)
	/* hubbub */
	if (wsi->http.perform_rewrite)
		lws_rewrite_parse(wsi->http.rw, (unsigned char *)*buf, n);
	else
#endif
	{
		if (
#if defined(LWS_WITH_HTTP_PROXY)
		    !wsi->protocol_bind_balance ==
		    !!wsi->http.proxy_clientside
#else
		    !!wsi->protocol_bind_balance
#endif
		  ) {
			if (user_callback_handle_rxflow(wsi->protocol->callback,
				wsi, LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,
				wsi->user_space, *buf, n)) {
				lwsl_info("%s: RECEIVE_CLIENT_HTTP_READ returned -1\n",
						__func__);

				return -1;
			}
		}